

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O3

bool tvm::runtime::RuntimeEnabled(string *target)

{
  int iVar1;
  ulong uVar2;
  PackedFunc *pPVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar4;
  bool bVar5;
  string f_name;
  string local_1d0;
  _Any_data local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  iVar1 = std::__cxx11::string::compare((char *)target);
  if (iVar1 == 0) {
    bVar5 = true;
    goto LAB_0010c323;
  }
  iVar1 = std::__cxx11::string::compare((char *)target);
  pcVar4 = "device_api.gpu";
  if (iVar1 == 0) {
LAB_0010c2f9:
    std::__cxx11::string::_M_replace
              ((ulong)&local_1d0,0,(char *)local_1d0._M_string_length,(ulong)pcVar4);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)target);
    if (iVar1 == 0) goto LAB_0010c2f9;
    iVar1 = std::__cxx11::string::compare((char *)target);
    pcVar4 = "device_api.opencl";
    if (iVar1 == 0) goto LAB_0010c2f9;
    iVar1 = std::__cxx11::string::compare((char *)target);
    if (iVar1 == 0) goto LAB_0010c2f9;
    iVar1 = std::__cxx11::string::compare((char *)target);
    if (iVar1 == 0) goto LAB_0010c2f9;
    iVar1 = std::__cxx11::string::compare((char *)target);
    pcVar4 = "device_api.opengl";
    if (iVar1 == 0) {
LAB_0010c365:
      std::__cxx11::string::operator=((string *)&local_1d0,pcVar4);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) goto LAB_0010c365;
      iVar1 = std::__cxx11::string::compare((char *)target);
      pcVar4 = "device_api.metal";
      if (iVar1 == 0) goto LAB_0010c365;
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) goto LAB_0010c365;
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) {
        pcVar4 = "device_api.vulkan";
        goto LAB_0010c365;
      }
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) {
        pcVar4 = "codegen.build_stackvm";
        goto LAB_0010c365;
      }
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) {
        pcVar4 = "device_api.rpc";
        goto LAB_0010c365;
      }
      iVar1 = std::__cxx11::string::compare((char *)target);
      pcVar4 = "device_api.vpi";
      if (iVar1 == 0) goto LAB_0010c365;
      iVar1 = std::__cxx11::string::compare((char *)target);
      if (iVar1 == 0) goto LAB_0010c365;
      uVar2 = target->_M_string_length;
      if (4 < uVar2) {
        std::__cxx11::string::substr((ulong)&local_1b0,(ulong)target);
        iVar1 = std::__cxx11::string::compare(local_1b0._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_unused._0_8_ != local_1a0) {
          operator_delete(local_1b0._M_unused._M_object,local_1a0[0]._M_allocated_capacity + 1);
        }
        if (iVar1 == 0) {
          pcVar4 = "device_api.gpu";
          goto LAB_0010c365;
        }
        uVar2 = target->_M_string_length;
      }
      if (3 < uVar2) {
        std::__cxx11::string::substr((ulong)&local_1b0,(ulong)target);
        iVar1 = std::__cxx11::string::compare(local_1b0._M_pod_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_unused._0_8_ != local_1a0) {
          operator_delete(local_1b0._M_unused._M_object,local_1a0[0]._M_allocated_capacity + 1);
        }
        if (iVar1 == 0) {
          pcVar4 = "device_api.rocm";
          goto LAB_0010c365;
        }
        if (3 < target->_M_string_length) {
          std::__cxx11::string::substr((ulong)&local_1b0,(ulong)target);
          iVar1 = std::__cxx11::string::compare(local_1b0._M_pod_data);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_unused._0_8_ != local_1a0) {
            operator_delete(local_1b0._M_unused._M_object,local_1a0[0]._M_allocated_capacity + 1);
          }
          if (iVar1 == 0) {
            local_1b0._M_unused._M_object = local_1a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b0,"codegen.llvm_target_enabled","");
            args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Registry::Get((string *)&local_1b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_unused._0_8_ != local_1a0) {
              operator_delete(local_1b0._M_unused._M_object,local_1a0[0]._M_allocated_capacity + 1);
            }
            if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar5 = false;
            }
            else {
              PackedFunc::operator()((PackedFunc *)&local_1b0,args);
              bVar5 = TVMPODValue_::operator_cast_to_bool((TVMPODValue_ *)&local_1b0);
              TVMRetValue::Clear((TVMRetValue *)&local_1b0);
            }
            goto LAB_0010c323;
          }
        }
      }
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module.cc"
                 ,0x9b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0._M_pod_data,"Unknown optional runtime ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0._M_pod_data,(target->_M_dataplus)._M_p,
                 target->_M_string_length);
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
  }
  pPVar3 = Registry::Get(&local_1d0);
  bVar5 = pPVar3 != (PackedFunc *)0x0;
LAB_0010c323:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool RuntimeEnabled(const std::string &target) {
  std::string f_name;
  if (target == "cpu") {
    return true;
  } else if (target == "cuda" || target == "gpu") {
    f_name = "device_api.gpu";
  } else if (target == "cl" || target == "opencl" || target == "sdaccel") {
    f_name = "device_api.opencl";
  } else if (target == "gl" || target == "opengl") {
    f_name = "device_api.opengl";
  } else if (target == "mtl" || target == "metal") {
    f_name = "device_api.metal";
  } else if (target == "vulkan") {
    f_name = "device_api.vulkan";
  } else if (target == "stackvm") {
    f_name = "codegen.build_stackvm";
  } else if (target == "rpc") {
    f_name = "device_api.rpc";
  } else if (target == "vpi" || target == "verilog") {
    f_name = "device_api.vpi";
  } else if (target.length() >= 5 && target.substr(0, 5) == "nvptx") {
    f_name = "device_api.gpu";
  } else if (target.length() >= 4 && target.substr(0, 4) == "rocm") {
    f_name = "device_api.rocm";
  } else if (target.length() >= 4 && target.substr(0, 4) == "llvm") {
    const PackedFunc *pf = runtime::Registry::Get("codegen.llvm_target_enabled");
    if (pf == nullptr)
      return false;
    return (*pf)(target);
  } else {
    LOG(FATAL) << "Unknown optional runtime " << target;
  }
  return runtime::Registry::Get(f_name) != nullptr;
}